

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmemory.c
# Opt level: O0

char * xmlMemStrdupLoc(char *str,char *file,int line)

{
  xmlGenericErrorFunc p_Var1;
  size_t sVar2;
  ulong uVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  undefined4 *puVar6;
  MEMHDR *p;
  size_t size;
  char *s;
  int line_local;
  char *file_local;
  char *str_local;
  
  sVar2 = strlen(str);
  uVar3 = sVar2 + 1;
  if (xmlMemInitialized == 0) {
    xmlInitMemory();
  }
  if (uVar3 < 0xffffffffffffffd8) {
    puVar6 = (undefined4 *)malloc(sVar2 + 0x29);
    if (puVar6 == (undefined4 *)0x0) {
      str_local = (char *)0x0;
    }
    else {
      *puVar6 = 0x5aa5;
      *(ulong *)(puVar6 + 4) = uVar3;
      puVar6[1] = 3;
      *(char **)(puVar6 + 6) = file;
      puVar6[8] = line;
      xmlMutexLock(xmlMemMutex);
      block = block + 1;
      *(ulong *)(puVar6 + 2) = (ulong)block;
      debugMemSize = uVar3 + debugMemSize;
      debugMemBlocks = debugMemBlocks + 1;
      if (debugMaxMemSize < debugMemSize) {
        debugMaxMemSize = debugMemSize;
      }
      xmlMutexUnlock(xmlMemMutex);
      str_local = (char *)(puVar6 + 10);
      if ((ulong)xmlMemStopAtBlock == *(ulong *)(puVar6 + 2)) {
        xmlMallocBreakpoint();
      }
      strcpy(str_local,str);
      if ((char *)xmlMemTraceBlockAt == str_local) {
        pp_Var4 = __xmlGenericError();
        p_Var1 = *pp_Var4;
        ppvVar5 = __xmlGenericErrorContext();
        (*p_Var1)(*ppvVar5,"%p : Strdup() Ok\n",xmlMemTraceBlockAt);
        xmlMallocBreakpoint();
      }
    }
  }
  else {
    pp_Var4 = __xmlGenericError();
    p_Var1 = *pp_Var4;
    ppvVar5 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar5,"xmlMemStrdupLoc : Unsigned overflow\n");
    xmlMemoryDump();
    str_local = (char *)0x0;
  }
  return str_local;
}

Assistant:

char *
xmlMemStrdupLoc(const char *str, const char *file, int line)
{
    char *s;
    size_t size = strlen(str) + 1;
    MEMHDR *p;

    if (!xmlMemInitialized) xmlInitMemory();
    TEST_POINT

    if (size > (MAX_SIZE_T - RESERVE_SIZE)) {
	xmlGenericError(xmlGenericErrorContext,
		"xmlMemStrdupLoc : Unsigned overflow\n");
	xmlMemoryDump();
	return(NULL);
    }

    p = (MEMHDR *) malloc(RESERVE_SIZE+size);
    if (!p) {
      goto error;
    }
    p->mh_tag = MEMTAG;
    p->mh_size = size;
    p->mh_type = STRDUP_TYPE;
    p->mh_file = file;
    p->mh_line = line;
    xmlMutexLock(xmlMemMutex);
    p->mh_number = ++block;
    debugMemSize += size;
    debugMemBlocks++;
    if (debugMemSize > debugMaxMemSize) debugMaxMemSize = debugMemSize;
#ifdef MEM_LIST
    debugmem_list_add(p);
#endif
    xmlMutexUnlock(xmlMemMutex);

    s = (char *) HDR_2_CLIENT(p);

    if (xmlMemStopAtBlock == p->mh_number) xmlMallocBreakpoint();

    strcpy(s,str);

    TEST_POINT

    if (xmlMemTraceBlockAt == s) {
	xmlGenericError(xmlGenericErrorContext,
			"%p : Strdup() Ok\n", xmlMemTraceBlockAt);
	xmlMallocBreakpoint();
    }

    return(s);

error:
    return(NULL);
}